

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int unixCheckReservedLock(sqlite3_file *id,int *pResOut)

{
  int iVar1;
  sqlite3_mutex *psVar2;
  int *piVar3;
  int iVar4;
  int iVar5;
  flock lock;
  
  if (sqlite3Config.bCoreMutex == 0) {
    psVar2 = (sqlite3_mutex *)0x0;
  }
  else {
    psVar2 = (*sqlite3Config.mutex.xMutexAlloc)(2);
  }
  if (psVar2 != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(psVar2);
  }
  if (*(byte *)((long)&(id[2].pMethods)->xRead + 4) < 2) {
    iVar5 = 0;
    iVar4 = 0;
    if (*(char *)((long)&(id[2].pMethods)->xRead + 5) == '\0') {
      iVar5 = 0;
      iVar1 = (*aSyscall[7].pCurrent)((ulong)*(uint *)&id[3].pMethods,5);
      if (iVar1 == 0) {
        iVar5 = 1;
      }
      else {
        piVar3 = __errno_location();
        *(int *)&id[4].pMethods = *piVar3;
        iVar4 = 0xe0a;
      }
    }
  }
  else {
    iVar4 = 0;
    iVar5 = 1;
  }
  if (sqlite3Config.bCoreMutex == 0) {
    psVar2 = (sqlite3_mutex *)0x0;
  }
  else {
    psVar2 = (*sqlite3Config.mutex.xMutexAlloc)(2);
  }
  if (psVar2 != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(psVar2);
  }
  *pResOut = iVar5;
  return iVar4;
}

Assistant:

static int unixCheckReservedLock(sqlite3_file *id, int *pResOut){
  int rc = SQLITE_OK;
  int reserved = 0;
  unixFile *pFile = (unixFile*)id;

  SimulateIOError( return SQLITE_IOERR_CHECKRESERVEDLOCK; );

  assert( pFile );
  unixEnterMutex(); /* Because pFile->pInode is shared across threads */

  /* Check if a thread in this process holds such a lock */
  if( pFile->pInode->eFileLock>SHARED_LOCK ){
    reserved = 1;
  }

  /* Otherwise see if some other process holds it.
  */
#ifndef __DJGPP__
  if( !reserved && !pFile->pInode->bProcessLock ){
    struct flock lock;
    lock.l_whence = SEEK_SET;
    lock.l_start = RESERVED_BYTE;
    lock.l_len = 1;
    lock.l_type = F_WRLCK;
    if( osFcntl(pFile->h, F_GETLK, &lock) ){
      rc = SQLITE_IOERR_CHECKRESERVEDLOCK;
      pFile->lastErrno = errno;
    } else if( lock.l_type!=F_UNLCK ){
      reserved = 1;
    }
  }
#endif
  
  unixLeaveMutex();
  OSTRACE(("TEST WR-LOCK %d %d %d (unix)\n", pFile->h, rc, reserved));

  *pResOut = reserved;
  return rc;
}